

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::InSequence::~InSequence(InSequence *this)

{
  Sequence **ppSVar1;
  byte *in_RDI;
  Sequence **in_stack_ffffffffffffffd8;
  ThreadLocal<testing::Sequence_*> *this_00;
  
  if ((*in_RDI & 1) != 0) {
    ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::get
                        ((ThreadLocal<testing::Sequence_*> *)0x14572f);
    this_00 = (ThreadLocal<testing::Sequence_*> *)*ppSVar1;
    if (this_00 != (ThreadLocal<testing::Sequence_*> *)0x0) {
      Sequence::~Sequence((Sequence *)0x145753);
      operator_delete(this_00);
    }
    internal::ThreadLocal<testing::Sequence_*>::set(this_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

InSequence::~InSequence() {
  if (sequence_created_) {
    delete internal::g_gmock_implicit_sequence.get();
    internal::g_gmock_implicit_sequence.set(NULL);
  }
}